

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O3

ContainerT * __thiscall
strq::Generator<std::__cxx11::string,void>::
random_push_backable<strq::Container<strq::Arithmetic<strq::detail::NoDistribution>>>
          (ContainerT *__return_storage_ptr__,Generator<std::__cxx11::string,void> *this,
          Container<strq::Arithmetic<strq::detail::NoDistribution>_> *schema)

{
  ulong uVar1;
  Generator<char,void> local_29;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (*(long *)(this + 8) != 0) {
    uVar1 = 0;
    do {
      Generator<char,void>::operator()(&local_29);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar1 = uVar1 + 1;
    } while (uVar1 < *(ulong *)(this + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

static auto random_push_backable(Schema&& schema) -> ContainerT
        {
            ContainerT cont;

            if constexpr (detail::trait::is_reservable <ContainerT>) {
                cont.reserve(schema.size());
            }

            for (auto i = 0; i < schema.size(); ++i) {
                cont.push_back(random<typename ContainerT::value_type>(schema.value()));
            }
            return cont;
        }